

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char_const*,char[26],char[8],char[8]>
          (string *__return_storage_ptr__,Diligent *this,char **Args,char (*Args_1) [26],
          char (*Args_2) [8],char (*Args_3) [8])

{
  stringstream ss;
  stringstream asStack_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  FormatStrSS<std::__cxx11::stringstream,char_const*>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_1b8,
             (char **)this);
  FormatStrSS<std::__cxx11::stringstream,char[26],char[8],char[8]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_1b8,
             (char (*) [26])Args,(char (*) [8])Args_1,Args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}